

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1)

{
  Data *this_00;
  undefined8 in_RAX;
  bool bVar1;
  undefined4 local_38;
  undefined4 local_34;
  OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  bVar1 = DAT_015b5fbd == '\0';
  if (bVar1) {
    local_34._2_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    local_34 = CONCAT22(local_34._2_2_,(short)R1);
  }
  if (bVar1 && R1 < 0x10000) {
    _local_38 = CONCAT44(local_34,6);
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,&local_38,6);
    AddJumpOffset(this,EndOfBlock,labelID,6);
  }
  return bVar1 && R1 < 0x10000;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg1(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1)
    {
        OpLayoutT_BrInt1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt1<SizePolicy>) - offsetof(OpLayoutT_BrInt1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }